

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_types.hpp
# Opt level: O0

void __thiscall
Satyricon::Clause::Clause
          (Clause *this,bool l,vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_> *lits
          )

{
  size_type sVar1;
  const_iterator __first;
  const_iterator __last;
  Iterator __result;
  double *pdVar2;
  vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_> *lits_local;
  bool l_local;
  Clause *this_local;
  
  *(uint *)this = *(uint *)this & 0xfffffffe | (uint)l;
  sVar1 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::size(lits);
  *(uint *)this = *(uint *)this & 1 | (int)sVar1 << 1;
  __first = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::begin(lits);
  __last = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::end(lits);
  __result = begin(this);
  std::
  copy<__gnu_cxx::__normal_iterator<Satyricon::Literal_const*,std::vector<Satyricon::Literal,std::allocator<Satyricon::Literal>>>,Satyricon::Literal*>
            ((__normal_iterator<const_Satyricon::Literal_*,_std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>_>
              )__first._M_current,
             (__normal_iterator<const_Satyricon::Literal_*,_std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>_>
              )__last._M_current,__result);
  if (((ulong)*this & 1) != 0) {
    pdVar2 = get_activity(this);
    *pdVar2 = 1.0;
  }
  return;
}

Assistant:

Clause(bool l,const std::vector<Literal> &lits) :
        learned(l), _size(lits.size()) {
            std::copy(lits.begin(),lits.end(),this->begin());
            if ( learned ) get_activity() = 1.0;
        }